

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_resume(Curl_easy *data,connectdata *conn,Curl_HttpReq httpreq)

{
  size_t sVar1;
  ulong local_48;
  size_t actuallyread;
  size_t readthisamountnow;
  curl_off_t passed;
  int seekerr;
  Curl_HttpReq httpreq_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((httpreq == HTTPREQ_POST) || (httpreq == HTTPREQ_PUT)) && ((data->state).resume_from != 0)) {
    if ((data->state).resume_from < 0) {
      (data->state).resume_from = 0;
    }
    if (((data->state).resume_from != 0) && ((*(uint *)&(data->state).field_0x6d0 >> 1 & 1) == 0)) {
      passed._0_4_ = 2;
      if (conn->seek_func != (curl_seek_callback)0x0) {
        Curl_set_in_callback(data,true);
        passed._0_4_ = (*conn->seek_func)(conn->seek_client,(data->state).resume_from,0);
        Curl_set_in_callback(data,false);
      }
      if ((int)passed != 0) {
        readthisamountnow = 0;
        if ((int)passed != 2) {
          Curl_failf(data,"Could not seek stream");
          return CURLE_READ_ERROR;
        }
        do {
          if ((long)(ulong)(data->set).buffer_size <
              (long)((data->state).resume_from - readthisamountnow)) {
            local_48 = (ulong)(data->set).buffer_size;
          }
          else {
            local_48 = curlx_sotouz((data->state).resume_from - readthisamountnow);
          }
          sVar1 = (*(data->state).fread_func)((data->state).buffer,1,local_48,(data->state).in);
          readthisamountnow = sVar1 + readthisamountnow;
          if ((sVar1 == 0) || (local_48 < sVar1)) {
            Curl_failf(data,"Could only read %ld bytes from the input",readthisamountnow);
            return CURLE_READ_ERROR;
          }
        } while ((long)readthisamountnow < (data->state).resume_from);
      }
      if ((0 < (data->state).infilesize) &&
         ((data->state).infilesize = (data->state).infilesize - (data->state).resume_from,
         (data->state).infilesize < 1)) {
        Curl_failf(data,"File already completely uploaded");
        return CURLE_PARTIAL_FILE;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_resume(struct Curl_easy *data,
                          struct connectdata *conn,
                          Curl_HttpReq httpreq)
{
  if((HTTPREQ_POST == httpreq || HTTPREQ_PUT == httpreq) &&
     data->state.resume_from) {
    /**********************************************************************
     * Resuming upload in HTTP means that we PUT or POST and that we have
     * got a resume_from value set. The resume value has already created
     * a Range: header that will be passed along. We need to "fast forward"
     * the file the given number of bytes and decrease the assume upload
     * file size before we continue this venture in the dark lands of HTTP.
     * Resuming mime/form posting at an offset > 0 has no sense and is ignored.
     *********************************************************************/

    if(data->state.resume_from < 0) {
      /*
       * This is meant to get the size of the present remote-file by itself.
       * We don't support this now. Bail out!
       */
      data->state.resume_from = 0;
    }

    if(data->state.resume_from && !data->state.this_is_a_follow) {
      /* do we still game? */

      /* Now, let's read off the proper amount of bytes from the
         input. */
      int seekerr = CURL_SEEKFUNC_CANTSEEK;
      if(conn->seek_func) {
        Curl_set_in_callback(data, true);
        seekerr = conn->seek_func(conn->seek_client, data->state.resume_from,
                                  SEEK_SET);
        Curl_set_in_callback(data, false);
      }

      if(seekerr != CURL_SEEKFUNC_OK) {
        curl_off_t passed = 0;

        if(seekerr != CURL_SEEKFUNC_CANTSEEK) {
          failf(data, "Could not seek stream");
          return CURLE_READ_ERROR;
        }
        /* when seekerr == CURL_SEEKFUNC_CANTSEEK (can't seek to offset) */
        do {
          size_t readthisamountnow =
            (data->state.resume_from - passed > data->set.buffer_size) ?
            (size_t)data->set.buffer_size :
            curlx_sotouz(data->state.resume_from - passed);

          size_t actuallyread =
            data->state.fread_func(data->state.buffer, 1, readthisamountnow,
                                   data->state.in);

          passed += actuallyread;
          if((actuallyread == 0) || (actuallyread > readthisamountnow)) {
            /* this checks for greater-than only to make sure that the
               CURL_READFUNC_ABORT return code still aborts */
            failf(data, "Could only read %" CURL_FORMAT_CURL_OFF_T
                  " bytes from the input", passed);
            return CURLE_READ_ERROR;
          }
        } while(passed < data->state.resume_from);
      }

      /* now, decrease the size of the read */
      if(data->state.infilesize>0) {
        data->state.infilesize -= data->state.resume_from;

        if(data->state.infilesize <= 0) {
          failf(data, "File already completely uploaded");
          return CURLE_PARTIAL_FILE;
        }
      }
      /* we've passed, proceed as normal */
    }
  }
  return CURLE_OK;
}